

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct16_stage6_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  int32_t cos_bit_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  
  alVar1 = *x;
  alVar2 = x[1];
  alVar3 = x[2];
  alVar4 = x[3];
  alVar5 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[7]);
  *x = alVar5;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[7]);
  x[7] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[6]);
  x[1] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[6]);
  x[6] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar3,(undefined1  [32])x[5]);
  x[2] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar3,(undefined1  [32])x[5]);
  x[5] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar4,(undefined1  [32])x[4]);
  x[3] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar4,(undefined1  [32])x[4]);
  x[4] = alVar1;
  alVar1[1]._0_4_ = 0xb500b50;
  alVar1[0] = 0xb500b500b500b50;
  alVar1[1]._4_4_ = 0xb500b50;
  alVar1[2]._0_4_ = 0xb500b50;
  alVar1[2]._4_4_ = 0xb500b50;
  alVar1[3]._0_4_ = 0xb500b50;
  alVar1[3]._4_4_ = 0xb500b50;
  alVar2[1]._0_4_ = 0xb50f4b0;
  alVar2[0] = 0xb50f4b00b50f4b0;
  alVar2[1]._4_4_ = 0xb50f4b0;
  alVar2[2]._0_4_ = 0xb50f4b0;
  alVar2[2]._4_4_ = 0xb50f4b0;
  alVar2[3]._0_4_ = 0xb50f4b0;
  alVar2[3]._4_4_ = 0xb50f4b0;
  alVar3[1] = in_XMM0_Qb;
  alVar3[0] = in_XMM0_Qa;
  alVar3[2] = in_YMM0_H;
  alVar3[3] = in_register_00001218;
  btf_16_w16_avx2(alVar1,alVar2,x + 10,x + 0xd,alVar3,0xb50);
  btf_16_w16_avx2(_r,(__m256i)in_stack_00000028,x + 0xb,x + 0xc,(__m256i)in_stack_00000048,
                  cos_bit_00);
  return;
}

Assistant:

static inline void idct16_stage6_avx2(__m256i *x, const int32_t *cospi,
                                      const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r, cos_bit);
}